

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

__pid_t __thiscall
so_5::disp::mpmc_queue_traits::combined_lock::actual_cond_t::wait
          (actual_cond_t *this,void *__stat_loc)

{
  __atomic_flag_data_type _Var1;
  long lVar2;
  spinlock_t *psVar3;
  int iVar4;
  __pid_t extraout_EAX;
  long lVar5;
  long lVar6;
  unique_lock<std::mutex> mutex_lock;
  unique_lock<std::mutex> local_28;
  
  this->m_signaled = false;
  lVar5 = std::chrono::_V2::system_clock::now();
  lVar2 = (this->m_waiting_time).__r;
  while( true ) {
    (this->m_spinlock->m_flag).super___atomic_flag_base._M_i = false;
    iVar4 = sched_yield();
    psVar3 = this->m_spinlock;
    while( true ) {
      LOCK();
      _Var1 = (psVar3->m_flag).super___atomic_flag_base._M_i;
      (psVar3->m_flag).super___atomic_flag_base._M_i = true;
      UNLOCK();
      if (_Var1 == false) break;
      iVar4 = sched_yield();
    }
    if (this->m_signaled != false) break;
    lVar6 = std::chrono::_V2::system_clock::now();
    if (lVar5 + lVar2 <= lVar6) {
      local_28._M_device = &this->m_mutex;
      local_28._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_28);
      local_28._M_owns = true;
      (this->m_spinlock->m_flag).super___atomic_flag_base._M_i = false;
      if (this->m_signaled == false) {
        do {
          std::condition_variable::wait((unique_lock *)&this->m_condition);
        } while (this->m_signaled != true);
      }
      psVar3 = this->m_spinlock;
      while( true ) {
        LOCK();
        _Var1 = (psVar3->m_flag).super___atomic_flag_base._M_i;
        (psVar3->m_flag).super___atomic_flag_base._M_i = true;
        UNLOCK();
        if (_Var1 == false) break;
        sched_yield();
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_28);
      return extraout_EAX;
    }
  }
  return CONCAT31((int3)((uint)iVar4 >> 8),_Var1);
}

Assistant:

SO_5_NOEXCEPT override
			{
				using hrc = std::chrono::high_resolution_clock;

				/*
				 * NOTE: spinlock of the parent lock object is already
				 * acquired by the current thread.
				 */
				m_signaled = false;

				//
				// Busy waiting stage.
				//

				// Limitation for busy waiting stage.
				const auto stop_point = hrc::now() + m_waiting_time;

				do
					{
						m_spinlock.unlock();

						std::this_thread::yield();

						m_spinlock.lock();

						if( m_signaled )
							return;
					}
				while( stop_point > hrc::now() );

				// If we are here then busy waiting stage failed (condition
				// is not signaled yet) and we must go to long-time waiting.
				//
				// NOTE: spinlock of the parent lock object is acquired by
				// the current thread.

				//
				// Long-time waiting stage.
				//

				// Personal mutex object must be acquired.
				std::unique_lock< std::mutex > mutex_lock{ m_mutex };
				// Spinlock of the parent lock can be released now.
				m_spinlock.unlock();

				// Wait on condition_variable.
				m_condition.wait( mutex_lock, [this]{ return m_signaled; } );

				// Spinlock must be reacquired to return the parent lock
				// in the state at the call to wait().
				m_spinlock.lock();
			}